

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
helics::apps::AppTextParser::preParseFile
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AppTextParser *this,
          vector<char,_std::allocator<char>_> *klines)

{
  int *piVar1;
  pointer pcVar2;
  pointer pcVar3;
  istream *piVar4;
  size_type sVar5;
  size_t ii;
  long lVar6;
  bool bVar7;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  reset(this);
  CLI::std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (size_type)
             ((klines->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
             (1 - (long)(klines->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start)),(allocator_type *)&str);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  do {
    bVar7 = false;
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            do {
              piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&this->filePtr,(string *)&str);
              if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
                std::__cxx11::string::~string((string *)&str);
                return __return_storage_ptr__;
              }
            } while (str._M_string_length == 0);
            sVar5 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    find_first_not_of(&str," \t\n\r",0);
          } while (sVar5 == 0xffffffffffffffff);
          if (!bVar7) break;
          bVar7 = true;
          if (((sVar5 + 2 < str._M_string_length) && (str._M_dataplus._M_p[sVar5] == '#')) &&
             (str._M_dataplus._M_p[sVar5 + 1] == '#')) {
            bVar7 = str._M_dataplus._M_p[sVar5 + 2] != ']';
          }
        }
        if (str._M_dataplus._M_p[sVar5] != '!') break;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,&str,sVar5 + 1,0xffffffffffffffff);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&this->configStr,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar7 = false;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(&this->configStr,'\n');
      }
      if (str._M_dataplus._M_p[sVar5] != '#') break;
      bVar7 = false;
      if ((sVar5 + 2 < str._M_string_length) &&
         (bVar7 = false, str._M_dataplus._M_p[sVar5 + 1] == '#')) {
        bVar7 = str._M_dataplus._M_p[sVar5 + 2] == '[';
      }
    }
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *piVar1 = *piVar1 + 1;
    pcVar2 = (klines->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (klines->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar6 = 0; (long)pcVar3 - (long)pcVar2 != lVar6; lVar6 = lVar6 + 1) {
      if (str._M_dataplus._M_p[sVar5] == pcVar2[lVar6]) {
        piVar1[lVar6 + 1] = piVar1[lVar6 + 1] + 1;
      }
    }
  } while( true );
}

Assistant:

std::vector<int> AppTextParser::preParseFile(const std::vector<char>& klines)
{
    reset();
    std::vector<int> counts(1 + klines.size());
    std::string str;
    bool inMline{false};
    // count the lines
    while (std::getline(filePtr, str)) {
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if (firstChar == std::string::npos) {
            continue;
        }
        if (inMline) {
            if (firstChar + 2 < str.size()) {
                if ((str[firstChar] == '#') && (str[firstChar + 1] == '#') &&
                    (str[firstChar + 2] == ']')) {
                    inMline = false;
                }
            }
            continue;
        }
        if (str[firstChar] == '#') {
            if (firstChar + 2 < str.size()) {
                if ((str[firstChar + 1] == '#') && (str[firstChar + 2] == '[')) {
                    inMline = true;
                }
            }
            continue;
        }
        if (str[firstChar] == '!') {
            configStr += str.substr(firstChar + 1);
            configStr.push_back('\n');
            continue;
        }

        ++counts[0];
        for (std::size_t ii = 0; ii < klines.size(); ++ii) {
            if (str[firstChar] == klines[ii]) {
                ++counts[ii + 1];
            }
        }
    }
    return counts;
}